

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O2

void player_resting_set_count(player *p,int16_t count)

{
  wchar_t wVar1;
  
  if (player_rest_disturb) {
    p->upkeep->resting = L'\0';
    player_rest_disturb = false;
    return;
  }
  if (-1 < count) {
    wVar1 = L'✏';
    if ((ushort)count < 10000) {
      wVar1 = (int)count;
    }
    p->upkeep->resting = wVar1;
    return;
  }
  if (0xfffb < (ushort)count) {
    p->upkeep->resting = (int)count;
    return;
  }
  p->upkeep->resting = L'\0';
  return;
}

Assistant:

void player_resting_set_count(struct player *p, int16_t count)
{
	/* Cancel if player is disturbed */
	if (player_rest_disturb) {
		p->upkeep->resting = 0;
		player_rest_disturb = false;
		return;
	}

	/* Ignore if the rest count is negative. */
	if ((count < 0) && !player_resting_is_special(count)) {
		p->upkeep->resting = 0;
		return;
	}

	/* Save the rest code */
	p->upkeep->resting = count;

	/* Truncate overlarge values */
	if (p->upkeep->resting > 9999) p->upkeep->resting = 9999;
}